

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setMinimizeMode(QMdiSubWindowPrivate *this)

{
  QMdiSubWindowPrivate *this_00;
  QMdiSubWindowPrivate *in_RDI;
  QMdiSubWindow *q;
  QMdiSubWindowPrivate *in_stack_00000018;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  QMdiSubWindowPrivate *in_stack_00000060;
  
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  ensureWindowState(in_stack_00000018,this._4_4_);
  in_RDI->isShadeRequestFromMinimizeMode = true;
  QMdiSubWindow::showShaded((QMdiSubWindow *)this);
  in_RDI->isShadeRequestFromMinimizeMode = false;
  in_RDI->moveEnabled = false;
  setEnabled(this_00,(WindowStateAction)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  setActive(in_stack_00000060,in_stack_0000005f,in_stack_0000005e);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setMinimizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMinimized);
    isShadeRequestFromMinimizeMode = true;
    q->showShaded();
    isShadeRequestFromMinimizeMode = false;

    moveEnabled = false;
#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
#endif

    Q_ASSERT(q->windowState() & Qt::WindowMinimized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMaximized));
    // This should be a valid assert, but people can actually re-implement
    // setVisible and do crazy stuff, so we're not guaranteed that
    // the widget is hidden after calling hide().
    // Q_ASSERT(baseWidget ? baseWidget->isHidden() : true);

    setActive(true);
}